

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O2

UInt32 crnlib::LitEnc_GetPrice(UInt16 *probs,UInt32 symbol,UInt32 *ProbPrices)

{
  UInt32 UVar1;
  uint uVar2;
  
  uVar2 = symbol | 0x100;
  UVar1 = 0;
  do {
    UVar1 = UVar1 + ProbPrices[((uint)(int)(char)uVar2 >> 7 & 0x7f0 ^ (uint)probs[uVar2 >> 8]) >> 4]
    ;
    uVar2 = uVar2 * 2;
  } while (uVar2 < 0x10000);
  return UVar1;
}

Assistant:

static UInt32 LitEnc_GetPrice(const CLzmaProb* probs, UInt32 symbol, UInt32* ProbPrices) {
  UInt32 price = 0;
  symbol |= 0x100;
  do {
    price += GET_PRICEa(probs[symbol >> 8], (symbol >> 7) & 1);
    symbol <<= 1;
  } while (symbol < 0x10000);
  return price;
}